

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct::create_pipeline(InnerProduct *this,Option *opt)

{
  bool bVar1;
  long in_RSI;
  Mat *in_RDI;
  Option opt_q;
  Mat weight_data_int8;
  Mat weight_data_r2;
  int num_input;
  Mat *in_stack_fffffffffffffea8;
  Allocator *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Mat *in_stack_fffffffffffffee8;
  Mat local_b0;
  Option *in_stack_ffffffffffffff98;
  Mat *in_stack_ffffffffffffffa0;
  Mat *in_stack_ffffffffffffffa8;
  Mat *in_stack_ffffffffffffffb0;
  int local_4;
  
  if ((((*(byte *)(in_RSI + 0x1e) & 1) != 0) && (in_RDI[4].allocator == (Allocator *)0x4)) &&
     (*(int *)((long)&in_RDI[3].data + 4) != 0)) {
    ncnn::Mat::reshape(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0
                       ,in_stack_fffffffffffffed8);
    ncnn::Mat::Mat(&local_b0);
    quantize_to_int8(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
    bVar1 = ncnn::Mat::empty(in_RDI);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      ncnn::Mat::reshape(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                         in_stack_fffffffffffffed8);
      ncnn::Mat::operator=(in_stack_fffffffffffffea8,in_RDI);
      ncnn::Mat::~Mat((Mat *)0x397f1f);
    }
    ncnn::Mat::~Mat((Mat *)0x397f34);
    ncnn::Mat::~Mat((Mat *)0x397f41);
    if (bVar1) {
      return local_4;
    }
  }
  return 0;
}

Assistant:

int InnerProduct::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int num_input = weight_data_size / num_output;

        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        Mat weight_data_int8;
        Option opt_q = opt;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#endif // NCNN_INT8

    return 0;
}